

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntercCommand.cpp
# Opt level: O2

void __thiscall EntercCommand::doCommand(EntercCommand *this)

{
  unsigned_long uVar1;
  char local_21 [8];
  char dummy;
  
  uVar1 = DataCommands::getIndex(this->dataCommands);
  fflush(_stdin);
  std::operator>>((istream *)&std::cin,local_21);
  fflush(_stdin);
  DataCommands::setIndex(this->dataCommands,uVar1 + 1);
  return;
}

Assistant:

void EntercCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;

    fflush(stdin);
    char dummy;
    cin >> dummy;
    fflush(stdin);

    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}